

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

void processingInstructionDebug(void *ctx,xmlChar *target,xmlChar *data)

{
  callbacks = callbacks + 1;
  if (data != (xmlChar *)0x0) {
    fprintf((FILE *)SAXdebug,"SAX.processingInstruction(%s, %s)\n",target);
    return;
  }
  fprintf((FILE *)SAXdebug,"SAX.processingInstruction(%s, NULL)\n",target);
  return;
}

Assistant:

static void
processingInstructionDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *target,
                      const xmlChar *data)
{
    callbacks++;
    if (quiet)
	return;
    if (data != NULL)
	fprintf(SAXdebug, "SAX.processingInstruction(%s, %s)\n",
		(char *) target, (char *) data);
    else
	fprintf(SAXdebug, "SAX.processingInstruction(%s, NULL)\n",
		(char *) target);
}